

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void PathBezierToCasteljau
               (ImVector<ImVec2> *path,float x1,float y1,float x2,float y2,float x3,float y3,
               float x4,float y4,float tess_tol,int level)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float y2_00;
  float fVar6;
  float y4_00;
  ImVec2 local_18;
  
  while( true ) {
    fVar5 = x4 - x1;
    fVar6 = y4 - y1;
    fVar3 = fVar6 * (x2 - x4) - fVar5 * (y2 - y4);
    fVar4 = fVar6 * (x3 - x4) - fVar5 * (y3 - y4);
    uVar1 = -(uint)(-fVar3 <= fVar3);
    uVar2 = -(uint)(-fVar4 <= fVar4);
    fVar3 = (float)(~uVar2 & (uint)-fVar4 | (uint)fVar4 & uVar2) +
            (float)(~uVar1 & (uint)-fVar3 | (uint)fVar3 & uVar1);
    if (fVar3 * fVar3 < (fVar5 * fVar5 + fVar6 * fVar6) * tess_tol) {
      local_18.x = x4;
      local_18.y = y4;
      ImVector<ImVec2>::push_back(path,&local_18);
      return;
    }
    if (9 < level) break;
    fVar3 = (x3 + x2) * 0.5;
    fVar5 = (y3 + y2) * 0.5;
    fVar6 = (x2 + x1) * 0.5;
    x3 = (x4 + x3) * 0.5;
    fVar4 = (fVar3 + fVar6) * 0.5;
    x2 = (fVar3 + x3) * 0.5;
    y2_00 = (y2 + y1) * 0.5;
    y3 = (y4 + y3) * 0.5;
    fVar3 = (fVar5 + y2_00) * 0.5;
    y2 = (fVar5 + y3) * 0.5;
    fVar5 = (x2 + fVar4) * 0.5;
    y4_00 = (y2 + fVar3) * 0.5;
    level = level + 1;
    PathBezierToCasteljau(path,x1,y1,fVar6,y2_00,fVar4,fVar3,fVar5,y4_00,tess_tol,level);
    x1 = fVar5;
    y1 = y4_00;
  }
  return;
}

Assistant:

static void PathBezierToCasteljau(ImVector<ImVec2>* path, float x1, float y1, float x2, float y2, float x3, float y3, float x4, float y4, float tess_tol, int level)
{
    float dx = x4 - x1;
    float dy = y4 - y1;
    float d2 = ((x2 - x4) * dy - (y2 - y4) * dx);
    float d3 = ((x3 - x4) * dy - (y3 - y4) * dx);
    d2 = (d2 >= 0) ? d2 : -d2;
    d3 = (d3 >= 0) ? d3 : -d3;
    if ((d2+d3) * (d2+d3) < tess_tol * (dx*dx + dy*dy))
    {
        path->push_back(ImVec2(x4, y4));
    }
    else if (level < 10)
    {
        float x12 = (x1+x2)*0.5f,       y12 = (y1+y2)*0.5f;
        float x23 = (x2+x3)*0.5f,       y23 = (y2+y3)*0.5f;
        float x34 = (x3+x4)*0.5f,       y34 = (y3+y4)*0.5f;
        float x123 = (x12+x23)*0.5f,    y123 = (y12+y23)*0.5f;
        float x234 = (x23+x34)*0.5f,    y234 = (y23+y34)*0.5f;
        float x1234 = (x123+x234)*0.5f, y1234 = (y123+y234)*0.5f;
        PathBezierToCasteljau(path, x1,y1,        x12,y12,    x123,y123,  x1234,y1234, tess_tol, level+1);
        PathBezierToCasteljau(path, x1234,y1234,  x234,y234,  x34,y34,    x4,y4,       tess_tol, level+1);
    }
}